

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  Type *args;
  Expression *args_1;
  Expression *pEVar2;
  bool bVar3;
  ulong uVar4;
  Expression *args_3;
  MinTypMaxExpression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  bitmask<slang::ast::ASTFlags> extraFlags_01;
  Expression *selected;
  Expression *local_58;
  Expression *local_50;
  Expression *local_48;
  SourceRange local_40;
  
  uVar4 = (ulong)(compilation->options).minTypMax;
  extraFlags_00.m_bits = 2;
  extraFlags_01.m_bits = 2;
  extraFlags.m_bits = 2;
  if (uVar4 < 3) {
    extraFlags_00.m_bits = *(underlying_type *)(&DAT_004bc1d8 + uVar4 * 8);
    extraFlags_01.m_bits = *(underlying_type *)(&DAT_004bc1f0 + uVar4 * 8);
    extraFlags.m_bits = *(underlying_type *)(&DAT_004bc208 + uVar4 * 8);
  }
  local_50 = Expression::create(compilation,(syntax->min).ptr,context,extraFlags,assignmentTarget);
  local_48 = Expression::create(compilation,(syntax->typ).ptr,context,extraFlags_01,assignmentTarget
                               );
  args_3 = Expression::create(compilation,(syntax->max).ptr,context,extraFlags_00,assignmentTarget);
  args_1 = local_50;
  local_58 = (Expression *)0x0;
  MVar1 = (compilation->options).minTypMax;
  pEVar2 = args_3;
  if (MVar1 != Max) {
    if (MVar1 == Typ) {
      local_58 = local_48;
      pEVar2 = local_58;
    }
    else {
      pEVar2 = local_58;
      if (MVar1 == Min) {
        local_58 = local_50;
        pEVar2 = local_58;
      }
    }
  }
  local_58 = pEVar2;
  args = (local_58->type).ptr;
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pEVar2 = local_48;
  expr = BumpAllocator::
         emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,args_1,local_48,args_3,&local_58,
                    &local_40);
  bVar3 = Expression::bad(args_1);
  if (((bVar3) || (bVar3 = Expression::bad(pEVar2), bVar3)) ||
     (bVar3 = Expression::bad(args_3), bVar3)) {
    expr = (MinTypMaxExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}